

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v8::detail::count_digits<4,fmt::v8::detail::fallback_uintptr>(fallback_uintptr n)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  fallback_uintptr n_local;
  
  iVar1 = 0x16;
  uVar3 = 8;
  do {
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
    bVar4 = n_local.value[uVar3];
    if (bVar4 != 0) goto LAB_0010e54a;
    iVar1 = iVar1 + -2;
  } while (1 < uVar2);
  iVar1 = 8;
  bVar4 = n.value[0];
LAB_0010e54a:
  uVar2 = 0x1f;
  if ((bVar4 | 1) != 0) {
    for (; (byte)((bVar4 | 1) >> uVar2) == 0; uVar2 = uVar2 - 1) {
    }
  }
  return iVar1 - ((uVar2 ^ 0x1c) >> 2);
}

Assistant:

FMT_FUNC int count_digits<4>(detail::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}